

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.h
# Opt level: O1

void chacha20poly1305_finalize(chacha20poly1305_context_t *ctx,uint8_t *tag)

{
  ulong uVar1;
  uint8_t lenbuf [16];
  size_t local_28;
  size_t local_20;
  
  uVar1 = ctx->textlen & 0xf;
  if (uVar1 != 0) {
    (*ctx->poly1305_update)(ctx,chacha20poly1305_encrypt_pad_zeros,0x10 - uVar1);
  }
  local_28 = ctx->aadlen;
  local_20 = ctx->textlen;
  (*ctx->poly1305_update)(ctx,&local_28,0x10);
  (*ctx->poly1305_finish)(ctx,tag);
  return;
}

Assistant:

static void chacha20poly1305_finalize(struct chacha20poly1305_context_t *ctx, uint8_t *tag)
{
    uint8_t lenbuf[16];

    chacha20poly1305_encrypt_pad(ctx, ctx->textlen);

    chacha20poly1305_write_u64(lenbuf, ctx->aadlen);
    chacha20poly1305_write_u64(lenbuf + 8, ctx->textlen);
    ctx->poly1305_update(ctx, lenbuf, sizeof(lenbuf));

    ctx->poly1305_finish(ctx, tag);
}